

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O2

int lib::base::Print(State *state)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ValueT VVar4;
  char *pcVar5;
  char *__format;
  int index;
  StackAPI api;
  
  luna::StackAPI::StackAPI(&api,state);
  iVar3 = luna::StackAPI::GetStackSize(&api);
  iVar1 = iVar3;
  if (iVar3 < 1) {
    iVar1 = 0;
  }
  index = 0;
  do {
    if (iVar1 == index) {
      putchar(10);
      return 0;
    }
    VVar4 = luna::StackAPI::GetValueType(&api,index);
    switch(VVar4) {
    case ValueT_Nil:
      printf("nil");
      goto switchD_00127add_caseD_3;
    case ValueT_Bool:
      bVar2 = luna::StackAPI::GetBool(&api,index);
      pcVar5 = "false";
      if (bVar2) {
        pcVar5 = "true";
      }
      __format = "%s";
      break;
    case ValueT_Number:
      luna::StackAPI::GetNumber(&api,index);
      printf("%.14g");
    default:
      goto switchD_00127add_caseD_3;
    case ValueT_String:
      pcVar5 = luna::StackAPI::GetCString(&api,index);
      __format = "%s";
      break;
    case ValueT_Closure:
      pcVar5 = (char *)luna::StackAPI::GetClosure(&api,index);
      goto LAB_00127b8c;
    case ValueT_Table:
      pcVar5 = (char *)luna::StackAPI::GetTable(&api,index);
      __format = "table:\t%p";
      break;
    case ValueT_UserData:
      pcVar5 = (char *)luna::StackAPI::GetUserData(&api,index);
      __format = "userdata:\t%p";
      break;
    case ValueT_CFunction:
      pcVar5 = (char *)luna::StackAPI::GetCFunction(&api,index);
LAB_00127b8c:
      __format = "function:\t%p";
    }
    printf(__format,pcVar5);
switchD_00127add_caseD_3:
    if (iVar3 + -1 != index) {
      putchar(9);
    }
    index = index + 1;
  } while( true );
}

Assistant:

int Print(luna::State *state)
    {
        luna::StackAPI api(state);
        int params = api.GetStackSize();

        for (int i = 0; i < params; ++i)
        {
            luna::ValueT type = api.GetValueType(i);

            switch (type) {
                case luna::ValueT_Nil:
                    printf("nil");
                    break;
                case luna::ValueT_Bool:
                    printf("%s", api.GetBool(i) ? "true" : "false");
                    break;
                case luna::ValueT_Number:
                    printf("%.14g", api.GetNumber(i));
                    break;
                case luna::ValueT_String:
                    printf("%s", api.GetCString(i));
                    break;
                case luna::ValueT_Closure:
                    printf("function:\t%p", api.GetClosure(i));
                    break;
                case luna::ValueT_Table:
                    printf("table:\t%p", api.GetTable(i));
                    break;
                case luna::ValueT_UserData:
                    printf("userdata:\t%p", api.GetUserData(i));
                    break;
                case luna::ValueT_CFunction:
                    printf("function:\t%p", api.GetCFunction(i));
                    break;
                default:
                    break;
            }

            if (i != params - 1)
                printf("\t");
        }

        printf("\n");
        return 0;
    }